

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

void __thiscall capnp::compiler::ModuleLoader::ModuleImpl::~ModuleImpl(ModuleImpl *this)

{
  Resolution *pRVar1;
  RemoveConst<capnp::compiler::Resolution> *pRVar2;
  Resolution *pRVar3;
  ArrayDisposer *pAVar4;
  char *pcVar5;
  size_t sVar6;
  String *pSVar7;
  ReadableFile *pRVar8;
  Disposer *pDVar9;
  
  pRVar1 = (this->resolutions).builder.ptr;
  if (pRVar1 != (Resolution *)0x0) {
    pRVar2 = (this->resolutions).builder.pos;
    pRVar3 = (this->resolutions).builder.endPtr;
    (this->resolutions).builder.ptr = (Resolution *)0x0;
    (this->resolutions).builder.pos = (RemoveConst<capnp::compiler::Resolution> *)0x0;
    (this->resolutions).builder.endPtr = (Resolution *)0x0;
    pAVar4 = (this->resolutions).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pRVar1,0x20,(long)pRVar2 - (long)pRVar1 >> 5,(long)pRVar3 - (long)pRVar1 >> 5,
               kj::ArrayDisposer::Dispose_<capnp::compiler::Resolution>::destruct);
  }
  if ((this->lineBreaks).ptr.ptr != (LineBreakTable *)0x0) {
    (this->lineBreaks).ptr.ptr = (LineBreakTable *)0x0;
    (**((this->lineBreaks).ptr.disposer)->_vptr_Disposer)();
  }
  pcVar5 = (this->sourceNameStr).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar6 = (this->sourceNameStr).content.size_;
    (this->sourceNameStr).content.ptr = (char *)0x0;
    (this->sourceNameStr).content.size_ = 0;
    pAVar4 = (this->sourceNameStr).content.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar5,1,sVar6,sVar6,0);
  }
  pSVar7 = (this->path).parts.ptr;
  if (pSVar7 != (String *)0x0) {
    sVar6 = (this->path).parts.size_;
    (this->path).parts.ptr = (String *)0x0;
    (this->path).parts.size_ = 0;
    pAVar4 = (this->path).parts.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pSVar7,0x18,sVar6,sVar6,kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pRVar8 = (this->file).ptr;
  if (pRVar8 != (ReadableFile *)0x0) {
    (this->file).ptr = (ReadableFile *)0x0;
    pDVar9 = (this->file).disposer;
    (**pDVar9->_vptr_Disposer)
              (pDVar9,(pRVar8->super_FsNode)._vptr_FsNode[-2] +
                      (long)&(pRVar8->super_FsNode)._vptr_FsNode);
    return;
  }
  return;
}

Assistant:

ModuleImpl(ModuleLoader::Impl& loader, kj::Own<const kj::ReadableFile> file,
             const kj::ReadableDirectory& sourceDir, kj::Path pathParam)
      : loader(loader), file(kj::mv(file)), sourceDir(sourceDir), path(kj::mv(pathParam)),
        sourceNameStr(path.toString()) {
    KJ_REQUIRE(path.size() > 0);
  }